

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O3

int pbrt::rply_vertex_callback(p_ply_argument argument)

{
  double dVar1;
  long flags;
  long index;
  Float *buffer;
  uint local_40 [2];
  long local_38;
  void *local_30;
  
  ply_get_argument_user_data(argument,&local_30,(long *)local_40);
  ply_get_argument_element(argument,(p_ply_element *)0x0,&local_38);
  dVar1 = ply_get_argument_value(argument);
  *(float *)((long)local_30 +
            (ulong)(local_40[0] & 0xf) * 4 + (ulong)(local_40[0] >> 4 & 0xf) * local_38 * 4) =
       (float)dVar1;
  return 1;
}

Assistant:

int rply_vertex_callback(p_ply_argument argument) {
    Float *buffer;
    long index, flags;

    ply_get_argument_user_data(argument, (void **)&buffer, &flags);
    ply_get_argument_element(argument, nullptr, &index);

    int stride = (flags & 0x0F0) >> 4;
    int offset = flags & 0x00F;

    buffer[index * stride + offset] = (float)ply_get_argument_value(argument);

    return 1;
}